

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

void __thiscall nvim::Nvim::ui_attach(Nvim *this,Integer width,Integer height,Dictionary *options)

{
  allocator local_59;
  Integer local_58;
  Integer local_50;
  string local_48;
  
  local_58 = height;
  local_50 = width;
  std::__cxx11::string::string((string *)&local_48,"nvim_ui_attach",&local_59);
  NvimRPC::
  call<long,long,std::multimap<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,std::less<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>,std::allocator<std::pair<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>const,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>>>>
            (&this->client_,&local_48,(nullptr_t)0x0,&local_50,&local_58,options);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void Nvim::ui_attach(Integer width, Integer height, const Dictionary& options) {
    client_.call("nvim_ui_attach", nullptr, width, height, options);
}